

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

bool __thiscall
ot::commissioner::CommissionerApp::OnJoinerFinalize
          (CommissionerApp *this,ByteArray *aJoinerId,string *aVendorName,string *aVendorModel,
          string *aVendorSwVersion,ByteArray *aVendorStackVersion,string *aProvisioningUrl,
          ByteArray *aVendorData)

{
  size_t __n;
  int iVar1;
  JoinerInfo *pJVar2;
  bool bVar3;
  
  bVar3 = false;
  pJVar2 = GetJoinerInfo(this,kMeshCoP,aJoinerId);
  if (pJVar2 != (JoinerInfo *)0x0) {
    __n = aProvisioningUrl->_M_string_length;
    if (__n == (pJVar2->mProvisioningUrl)._M_string_length) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp((aProvisioningUrl->_M_dataplus)._M_p,
                     (pJVar2->mProvisioningUrl)._M_dataplus._M_p,__n);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool CommissionerApp::OnJoinerFinalize(const ByteArray   &aJoinerId,
                                       const std::string &aVendorName,
                                       const std::string &aVendorModel,
                                       const std::string &aVendorSwVersion,
                                       const ByteArray   &aVendorStackVersion,
                                       const std::string &aProvisioningUrl,
                                       const ByteArray   &aVendorData)
{
    (void)aVendorName;
    (void)aVendorModel;
    (void)aVendorSwVersion;
    (void)aVendorStackVersion;
    (void)aVendorData;

    bool accepted = false;

    auto configuredJoinerInfo = GetJoinerInfo(JoinerType::kMeshCoP, aJoinerId);

    // TODO(deimi): logging
    VerifyOrExit(configuredJoinerInfo != nullptr, accepted = false);
    VerifyOrExit(aProvisioningUrl == configuredJoinerInfo->mProvisioningUrl, accepted = false);

    accepted = true;

exit:
    return accepted;
}